

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.hpp
# Opt level: O0

void protozero::skip_varint(char **data,char *end)

{
  varint_too_long_exception *this;
  end_of_buffer_exception *this_00;
  bool bVar1;
  char *local_30;
  int8_t *p;
  int8_t *iend;
  int8_t *begin;
  char *end_local;
  char **data_local;
  
  local_30 = *data;
  while( true ) {
    bVar1 = false;
    if (local_30 != end) {
      bVar1 = *local_30 < '\0';
    }
    if (!bVar1) break;
    local_30 = local_30 + 1;
  }
  if (9 < (long)local_30 - (long)*data) {
    this = (varint_too_long_exception *)__cxa_allocate_exception(8);
    memset(this,0,8);
    varint_too_long_exception::varint_too_long_exception(this);
    __cxa_throw(this,&varint_too_long_exception::typeinfo,
                varint_too_long_exception::~varint_too_long_exception);
  }
  if (local_30 == end) {
    this_00 = (end_of_buffer_exception *)__cxa_allocate_exception(8);
    memset(this_00,0,8);
    end_of_buffer_exception::end_of_buffer_exception(this_00);
    __cxa_throw(this_00,&end_of_buffer_exception::typeinfo,
                end_of_buffer_exception::~end_of_buffer_exception);
  }
  *data = local_30 + 1;
  return;
}

Assistant:

inline void skip_varint(const char** data, const char* end) {
    const auto* begin = reinterpret_cast<const int8_t*>(*data);
    const auto* iend = reinterpret_cast<const int8_t*>(end);
    const int8_t* p = begin;

    while (p != iend && *p < 0) {
        ++p;
    }

    if (p - begin >= max_varint_length) {
        throw varint_too_long_exception{};
    }

    if (p == iend) {
        throw end_of_buffer_exception{};
    }

    ++p;

    *data = reinterpret_cast<const char*>(p);
}